

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_write.c
# Opt level: O3

int xlsxiowrite_close(xlsxiowriter handle)

{
  column_info_struct *pcVar1;
  column_info_struct *__ptr;
  FILE *__s;
  
  if (handle == (xlsxiowriter)0x0) {
    return -1;
  }
  __s = (FILE *)handle->pipe_write;
  if (__s != (FILE *)0x0) {
    if (handle->sheetopen == 0) {
      flush_buffer(handle);
      __s = (FILE *)handle->pipe_write;
    }
    if (handle->rowopen != 0) {
      fwrite("</row>",6,1,__s);
      __s = (FILE *)handle->pipe_write;
    }
    fputs(worksheet_xml_end,__s);
    fclose((FILE *)handle->pipe_write);
  }
  pthread_join(handle->thread,(void **)0x0);
  __ptr = handle->columninfo;
  while (__ptr != (column_info_struct *)0x0) {
    pcVar1 = __ptr->next;
    free(__ptr);
    __ptr = pcVar1;
  }
  free(handle->filename);
  free(handle->sheetname);
  if (handle->zip != (zipFile *)0x0) {
    zipClose(handle->zip,0);
  }
  if ((FILE *)handle->pipe_read != (FILE *)0x0) {
    fclose((FILE *)handle->pipe_read);
  }
  free(handle);
  return 0;
}

Assistant:

DLL_EXPORT_XLSXIO int xlsxiowrite_close (xlsxiowriter handle)
{
  struct column_info_struct* colinfo;
  struct column_info_struct* colinfonext;
  if (!handle)
    return -1;
  //finalize data
  if (handle->pipe_write) {
    //check if buffer should be flushed
    if (!handle->sheetopen)
      flush_buffer(handle);
    //close row if needed
    if (handle->rowopen)
      fprintf(handle->pipe_write, "</row>" OPTIONAL_LINE_BREAK);
    //write worksheet data
    fprintf(handle->pipe_write, "%s", worksheet_xml_end);
    //close pipe
    fclose(handle->pipe_write);
  }
  //wait for thread to finish
#ifdef USE_WINTHREADS
  WaitForSingleObject(handle->thread, INFINITE);
#else
  pthread_join(handle->thread, NULL);
#endif
  //clean up
  colinfo = handle->columninfo;
  while (colinfo) {
    colinfonext = colinfo->next;
    free(colinfo);
    colinfo = colinfonext;
  }
  free(handle->filename);
  free(handle->sheetname);
  if (handle->zip)
#ifdef USE_MINIZIP
    zipClose(handle->zip, NULL);
#else
    zip_close(handle->zip);
#endif
  if (handle->pipe_read)
    fclose(handle->pipe_read);
  free(handle);
  return 0;
}